

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist.hpp
# Opt level: O2

vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
cast<float,std::byte,784ul>
          (vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
           *__return_storage_ptr__,
          vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> *i)

{
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<std::array<std::byte,784ul>const*,std::vector<std::array<std::byte,784ul>,std::allocator<std::array<std::byte,784ul>>>>,std::back_insert_iterator<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,cast<float,std::byte,784ul>(std::vector<std::array<std::byte,784ul>,std::allocator<std::array<std::byte,784ul>>>const&)::_lambda(std::array<std::byte,784ul>const&)_1_>
            ((i->
             super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (i->
             super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<U_, N_>> cast(std::vector<std::array<T_, N_>> const& i) {
  std::vector<std::array<U_, N_>> c;
  std::transform(
      i.begin(),
      i.end(),
      std::back_inserter(c),
      [](std::array<T_, N_> const& a) -> std::array<U_, N_> {
        return cast<U_>(a);
      });
  return c;
}